

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_thread.hpp
# Opt level: O2

void __thiscall
so_5::disp::prio_one_thread::reuse::
work_thread_template_t<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::no_activity_tracking_impl_t>
::body(work_thread_template_t<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::no_activity_tracking_impl_t>
       *this)

{
  tuple<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t_*,_std::default_delete<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t>_>
  in_RAX;
  pthread_t pVar1;
  at_exit_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sigman78[P]sobjectizer_so_5_disp_prio_one_thread_reuse_h_work_thread_hpp:226:7)>
  work_meter_stopper;
  demand_unique_ptr_t d;
  __uniq_ptr_impl<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t,_std::default_delete<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t>_>
  local_18;
  
  local_18._M_t.
  super__Tuple_impl<0UL,_so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t_*,_std::default_delete<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t>_>
  .super__Head_base<0UL,_so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t_*,_false>.
  _M_head_impl = (tuple<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t_*,_std::default_delete<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t>_>
                  )(tuple<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t_*,_std::default_delete<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t>_>
                    )in_RAX.
                     super__Tuple_impl<0UL,_so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t_*,_std::default_delete<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t>_>
                     .
                     super__Head_base<0UL,_so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t_*,_false>
                     ._M_head_impl;
  pVar1 = pthread_self();
  *(pthread_t *)(this + 0x10) = pVar1;
  do {
    pop_demand((work_thread_template_t<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::no_activity_tracking_impl_t>
                *)&local_18);
    (**(code **)((long)local_18._M_t.
                       super__Tuple_impl<0UL,_so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t_*,_std::default_delete<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t>_>
                       .
                       super__Head_base<0UL,_so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t_*,_false>
                       ._M_head_impl + 0x28))(*(undefined8 *)(this + 0x10));
    std::
    unique_ptr<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t,_std::default_delete<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t>_>
    ::~unique_ptr((unique_ptr<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t,_std::default_delete<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t>_>
                   *)&local_18);
  } while( true );
}

Assistant:

void
		body()
			{
				this->m_thread_id = so_5::query_current_thread_id();

				try
					{
						for(;;)
							{
								auto d = this->pop_demand();
								this->call_handler( *d );
							}
					}
				catch( const typename DEMAND_QUEUE::shutdown_ex_t & )
					{}
			}